

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O2

void __thiscall
QGridLayoutRowData::stealBox
          (QGridLayoutRowData *this,int start,int end,int which,qreal *positions,qreal *sizes)

{
  char *pcVar1;
  long lVar2;
  double dVar3;
  
  pcVar1 = (this->ignore).d.d.ptr;
  dVar3 = 0.0;
  lVar2 = 0;
  while( true ) {
    if ((long)end <= start + lVar2) {
      return;
    }
    if (((byte)pcVar1[(start + lVar2 >> 3) + 1] >> (start + (int)lVar2 & 7U) & 1) == 0) break;
    positions[lVar2] = dVar3;
    sizes[lVar2] = 0.0;
    dVar3 = dVar3 + 0.0;
    lVar2 = lVar2 + 1;
  }
  (*(code *)(&DAT_005ff16c + *(int *)(&DAT_005ff16c + (ulong)(uint)which * 4)))(dVar3,0);
  return;
}

Assistant:

void QGridLayoutRowData::stealBox(int start, int end, int which, qreal *positions, qreal *sizes)
{
    qreal offset = 0.0;
    qreal nextSpacing = 0.0;

    for (int i = start; i < end; ++i) {
        qreal avail = 0.0;

        if (!ignore.testBit(i)) {
            const QGridLayoutBox &box = boxes.at(i);
            avail = box.q_sizes(which);
            offset += nextSpacing;
            nextSpacing = spacings.at(i);
        }

        *positions++ = offset;
        *sizes++ = avail;
        offset += avail;
    }
}